

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

void makelabel(int tabindex,char *label)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char indexstr [5];
  char local_2d [5];
  
  *label = '\0';
  switch(symtab[tabindex].symtype) {
  case stprogram:
  case stparameter:
  case stvariable:
  case stprocedure:
    iVar1 = symtab[tabindex].thisname;
    if (nametable[iVar1].strlength < 1) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      lVar5 = (long)nametable[iVar1].strstart;
      do {
        label[uVar4] = stringtable[lVar5];
        uVar4 = uVar4 + 1;
        lVar6 = (long)nametable[iVar1].strstart;
        if (nametable[iVar1].strlength + lVar6 <= lVar5 + 1) break;
        bVar2 = lVar5 < lVar6 + 4;
        lVar5 = lVar5 + 1;
      } while (bVar2);
      uVar4 = uVar4 & 0xffffffff;
    }
    label[uVar4] = '\0';
    sVar3 = strlen(label);
    if (sVar3 < 5) goto switchD_00107bfb_caseD_6;
    break;
  default:
    goto switchD_00107bfb_caseD_6;
  case stlabel:
    builtin_strncpy(label,"_loop",6);
    break;
  case stliteral:
    if (symtab[tabindex].dataclass == dtinteger) {
      iVar1 = symtab[tabindex].thisname;
      if (nametable[iVar1].strlength < 1) {
        uVar4 = 0;
      }
      else {
        lVar5 = (long)nametable[iVar1].strstart;
        uVar4 = 0;
        do {
          label[uVar4] = stringtable[lVar5 + uVar4];
          lVar6 = lVar5 + uVar4;
          uVar4 = uVar4 + 1;
        } while (lVar6 + 1 < (long)nametable[iVar1].strlength + (long)nametable[iVar1].strstart);
        uVar4 = uVar4 & 0xffffffff;
      }
      label[uVar4] = '\0';
      goto switchD_00107bfb_caseD_6;
    }
  case sttempvar:
    label[0] = '_';
    label[1] = 't';
    label[2] = '\0';
  }
  sprintf(local_2d,"%d",(ulong)(uint)tabindex);
  strcat(label,local_2d);
switchD_00107bfb_caseD_6:
  strcpy(symtab[tabindex].label,label);
  return;
}

Assistant:

void	makelabel(int tabindex, char *label)
{
    int		i, j, k;
    char		indexstr[5];
    
    label[0] = '\0';
    switch (symclass(tabindex))	{
        case stliteral:
            if (data_class(tabindex) == dtinteger)	{
                i = symtab[tabindex].thisname;
                
                for  (k = 0, j = nametable[i].strstart;
                      j < nametable[i].strstart+
                      nametable[i].strlength;
                      j++, k++)
                    label[k] = stringtable[j];
                label[k] = '\0';
                break;
            }
            
            
        case sttempvar:
            label[0] = '_';
            label[1] = 't';
            label[2] = '\0';
            //itoa(tabindex, indexstr, 10);
            sprintf(indexstr, "%d", tabindex);
            strcat(label, indexstr);
            break;
            
        case stlabel:
            strcpy(label, "_loop");
            //itoa(tabindex, indexstr, 10);
            sprintf(indexstr, "%d", tabindex);
            strcat(label, indexstr);
            break;
        case stprogram:
        case stvariable:
        case stparameter:
        case stprocedure:
            i = symtab[tabindex].thisname;
            
            for (k = 0, j = nametable[i].strstart; j < nametable[i].strstart+nametable[i].strlength && j < nametable[i].strstart+5; j++, k++)
                label[k] = stringtable[j];
            label[k] = '\0';
            if (strlen(label) >= 5)	{
                //itoa(tabindex, indexstr, 10);
                sprintf(indexstr, "%d", tabindex);
                strcat(label, indexstr);
            }
            
        default: break;
    }
    strcpy(symtab[tabindex].label, label);
    //printf("Tabindex is %d\n", tabindex);
}